

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  RayK<8> *pRVar28;
  byte bVar29;
  byte bVar30;
  int iVar31;
  ulong uVar32;
  byte bVar33;
  undefined1 (*pauVar34) [32];
  ulong uVar35;
  byte bVar36;
  undefined4 uVar37;
  ulong uVar38;
  NodeRef root;
  long lVar39;
  ulong uVar40;
  ulong *puVar41;
  bool bVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  uint uVar70;
  uint uVar71;
  uint uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar76 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar84 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2b19;
  size_t local_2b18;
  RayK<8> *local_2b10;
  BVH *local_2b08;
  Intersectors *local_2b00;
  RayQueryContext *local_2af8;
  RayK<8> *local_2af0;
  ulong local_2ae8;
  undefined1 local_2ae0 [32];
  ulong local_2ab8;
  RTCFilterFunctionNArguments local_2ab0;
  undefined1 local_2a80 [32];
  int local_2a60;
  int iStack_2a5c;
  int iStack_2a58;
  int iStack_2a54;
  int iStack_2a50;
  int iStack_2a4c;
  int iStack_2a48;
  int iStack_2a44;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2960;
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  undefined4 uStack_2824;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined4 uStack_2804;
  undefined1 local_2800 [32];
  int local_27e0;
  int iStack_27dc;
  int iStack_27d8;
  int iStack_27d4;
  int iStack_27d0;
  int iStack_27cc;
  int iStack_27c8;
  int iStack_27c4;
  uint local_27c0;
  uint uStack_27bc;
  uint uStack_27b8;
  uint uStack_27b4;
  uint uStack_27b0;
  uint uStack_27ac;
  uint uStack_27a8;
  uint uStack_27a4;
  uint local_27a0;
  uint uStack_279c;
  uint uStack_2798;
  uint uStack_2794;
  uint uStack_2790;
  uint uStack_278c;
  uint uStack_2788;
  uint uStack_2784;
  uint local_2780;
  uint uStack_277c;
  uint uStack_2778;
  uint uStack_2774;
  uint uStack_2770;
  uint uStack_276c;
  uint uStack_2768;
  uint uStack_2764;
  undefined1 local_2760 [32];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  
  local_2b08 = (BVH *)This->ptr;
  if ((local_2b08->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar47 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar44 = ZEXT816(0) << 0x40;
      uVar43 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar44),5);
      uVar40 = vpcmpeqd_avx512vl(auVar47,(undefined1  [32])valid_i->field_0);
      uVar43 = uVar43 & uVar40;
      bVar30 = (byte)uVar43;
      if (bVar30 != 0) {
        local_2960._0_4_ = *(undefined4 *)ray;
        local_2960._4_4_ = *(undefined4 *)(ray + 4);
        local_2960._8_4_ = *(undefined4 *)(ray + 8);
        local_2960._12_4_ = *(undefined4 *)(ray + 0xc);
        local_2960._16_4_ = *(undefined4 *)(ray + 0x10);
        local_2960._20_4_ = *(undefined4 *)(ray + 0x14);
        local_2960._24_4_ = *(undefined4 *)(ray + 0x18);
        local_2960._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_2960._32_4_ = *(undefined4 *)(ray + 0x20);
        local_2960._36_4_ = *(undefined4 *)(ray + 0x24);
        local_2960._40_4_ = *(undefined4 *)(ray + 0x28);
        local_2960._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_2960._48_4_ = *(undefined4 *)(ray + 0x30);
        local_2960._52_4_ = *(undefined4 *)(ray + 0x34);
        local_2960._56_4_ = *(undefined4 *)(ray + 0x38);
        local_2960._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_2960._64_4_ = *(undefined4 *)(ray + 0x40);
        local_2960._68_4_ = *(undefined4 *)(ray + 0x44);
        local_2960._72_4_ = *(undefined4 *)(ray + 0x48);
        local_2960._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_2960._80_4_ = *(undefined4 *)(ray + 0x50);
        local_2960._84_4_ = *(undefined4 *)(ray + 0x54);
        local_2960._88_4_ = *(undefined4 *)(ray + 0x58);
        local_2960._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_2900 = *(undefined1 (*) [32])(ray + 0x80);
        local_28e0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_28c0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar79 = ZEXT3264(auVar47);
        vandps_avx512vl(local_2900,auVar47);
        auVar48._8_4_ = 0x219392ef;
        auVar48._0_8_ = 0x219392ef219392ef;
        auVar48._12_4_ = 0x219392ef;
        auVar48._16_4_ = 0x219392ef;
        auVar48._20_4_ = 0x219392ef;
        auVar48._24_4_ = 0x219392ef;
        auVar48._28_4_ = 0x219392ef;
        uVar40 = vcmpps_avx512vl(auVar47,auVar48,1);
        bVar42 = (bool)((byte)uVar40 & 1);
        auVar50._0_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_2900._0_4_;
        bVar42 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_2900._4_4_;
        bVar42 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_2900._8_4_;
        bVar42 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_2900._12_4_;
        bVar42 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_2900._16_4_;
        bVar42 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_2900._20_4_;
        bVar42 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_2900._24_4_;
        bVar42 = SUB81(uVar40 >> 7,0);
        auVar50._28_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_2900._28_4_;
        vandps_avx512vl(local_28e0,auVar47);
        uVar40 = vcmpps_avx512vl(auVar50,auVar48,1);
        bVar42 = (bool)((byte)uVar40 & 1);
        auVar51._0_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28e0._0_4_;
        bVar42 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28e0._4_4_;
        bVar42 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28e0._8_4_;
        bVar42 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28e0._12_4_;
        bVar42 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28e0._16_4_;
        bVar42 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28e0._20_4_;
        bVar42 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28e0._24_4_;
        bVar42 = SUB81(uVar40 >> 7,0);
        auVar51._28_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28e0._28_4_;
        vandps_avx512vl(local_28c0,auVar47);
        uVar40 = vcmpps_avx512vl(auVar51,auVar48,1);
        bVar42 = (bool)((byte)uVar40 & 1);
        auVar47._0_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28c0._0_4_;
        bVar42 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28c0._4_4_;
        bVar42 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28c0._8_4_;
        bVar42 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28c0._12_4_;
        bVar42 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28c0._16_4_;
        bVar42 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28c0._20_4_;
        bVar42 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28c0._24_4_;
        bVar42 = SUB81(uVar40 >> 7,0);
        auVar47._28_4_ = (uint)bVar42 * 0x219392ef | (uint)!bVar42 * local_28c0._28_4_;
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar80 = ZEXT3264(auVar48);
        auVar49 = vrcp14ps_avx512vl(auVar50);
        auVar50 = vfnmadd213ps_avx512vl(auVar50,auVar49,auVar48);
        auVar46 = vfmadd132ps_fma(auVar50,auVar49,auVar49);
        auVar50 = vrcp14ps_avx512vl(auVar51);
        auVar51 = vfnmadd213ps_avx512vl(auVar51,auVar50,auVar48);
        auVar15 = vfmadd132ps_fma(auVar51,auVar50,auVar50);
        auVar50 = vrcp14ps_avx512vl(auVar47);
        auVar47 = vfnmadd213ps_avx512vl(auVar47,auVar50,auVar48);
        local_28a0 = ZEXT1632(auVar46);
        local_2880 = ZEXT1632(auVar15);
        auVar16 = vfmadd132ps_fma(auVar47,auVar50,auVar50);
        local_2860 = ZEXT1632(auVar16);
        local_2840 = (float)local_2960._0_4_ * auVar46._0_4_;
        fStack_283c = (float)local_2960._4_4_ * auVar46._4_4_;
        fStack_2838 = (float)local_2960._8_4_ * auVar46._8_4_;
        fStack_2834 = (float)local_2960._12_4_ * auVar46._12_4_;
        fStack_2830 = (float)local_2960._16_4_ * 0.0;
        fStack_282c = (float)local_2960._20_4_ * 0.0;
        fStack_2828 = (float)local_2960._24_4_ * 0.0;
        local_2820 = (float)local_2960._32_4_ * auVar15._0_4_;
        fStack_281c = (float)local_2960._36_4_ * auVar15._4_4_;
        fStack_2818 = (float)local_2960._40_4_ * auVar15._8_4_;
        fStack_2814 = (float)local_2960._44_4_ * auVar15._12_4_;
        fStack_2810 = (float)local_2960._48_4_ * 0.0;
        fStack_280c = (float)local_2960._52_4_ * 0.0;
        fStack_2808 = (float)local_2960._56_4_ * 0.0;
        local_2800._4_4_ = (float)local_2960._68_4_ * auVar16._4_4_;
        local_2800._0_4_ = (float)local_2960._64_4_ * auVar16._0_4_;
        local_2800._8_4_ = (float)local_2960._72_4_ * auVar16._8_4_;
        local_2800._12_4_ = (float)local_2960._76_4_ * auVar16._12_4_;
        local_2800._16_4_ = (float)local_2960._80_4_ * 0.0;
        local_2800._20_4_ = (float)local_2960._84_4_ * 0.0;
        local_2800._24_4_ = (float)local_2960._88_4_ * 0.0;
        local_2800._28_4_ = local_2960._92_4_;
        uVar40 = vcmpps_avx512vl(ZEXT1632(auVar46),ZEXT1632(auVar44),1);
        auVar47 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_27e0 = (uint)((byte)uVar40 & 1) * auVar47._0_4_;
        iStack_27dc = (uint)((byte)(uVar40 >> 1) & 1) * auVar47._4_4_;
        iStack_27d8 = (uint)((byte)(uVar40 >> 2) & 1) * auVar47._8_4_;
        iStack_27d4 = (uint)((byte)(uVar40 >> 3) & 1) * auVar47._12_4_;
        iStack_27d0 = (uint)((byte)(uVar40 >> 4) & 1) * auVar47._16_4_;
        iStack_27cc = (uint)((byte)(uVar40 >> 5) & 1) * auVar47._20_4_;
        iStack_27c8 = (uint)((byte)(uVar40 >> 6) & 1) * auVar47._24_4_;
        iStack_27c4 = (uint)(byte)(uVar40 >> 7) * auVar47._28_4_;
        auVar50 = ZEXT1632(auVar44);
        uVar40 = vcmpps_avx512vl(ZEXT1632(auVar15),auVar50,5);
        auVar47 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar42 = (bool)((byte)uVar40 & 1);
        local_27c0 = (uint)bVar42 * auVar47._0_4_ | (uint)!bVar42 * 0x30;
        bVar42 = (bool)((byte)(uVar40 >> 1) & 1);
        uStack_27bc = (uint)bVar42 * auVar47._4_4_ | (uint)!bVar42 * 0x30;
        bVar42 = (bool)((byte)(uVar40 >> 2) & 1);
        uStack_27b8 = (uint)bVar42 * auVar47._8_4_ | (uint)!bVar42 * 0x30;
        bVar42 = (bool)((byte)(uVar40 >> 3) & 1);
        uStack_27b4 = (uint)bVar42 * auVar47._12_4_ | (uint)!bVar42 * 0x30;
        bVar42 = (bool)((byte)(uVar40 >> 4) & 1);
        uStack_27b0 = (uint)bVar42 * auVar47._16_4_ | (uint)!bVar42 * 0x30;
        bVar42 = (bool)((byte)(uVar40 >> 5) & 1);
        uStack_27ac = (uint)bVar42 * auVar47._20_4_ | (uint)!bVar42 * 0x30;
        bVar42 = (bool)((byte)(uVar40 >> 6) & 1);
        uStack_27a8 = (uint)bVar42 * auVar47._24_4_ | (uint)!bVar42 * 0x30;
        bVar42 = SUB81(uVar40 >> 7,0);
        uStack_27a4 = (uint)bVar42 * auVar47._28_4_ | (uint)!bVar42 * 0x30;
        uVar40 = vcmpps_avx512vl(ZEXT1632(auVar16),auVar50,5);
        auVar47 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar42 = (bool)((byte)uVar40 & 1);
        local_27a0 = (uint)bVar42 * auVar47._0_4_ | (uint)!bVar42 * 0x50;
        bVar42 = (bool)((byte)(uVar40 >> 1) & 1);
        uStack_279c = (uint)bVar42 * auVar47._4_4_ | (uint)!bVar42 * 0x50;
        bVar42 = (bool)((byte)(uVar40 >> 2) & 1);
        uStack_2798 = (uint)bVar42 * auVar47._8_4_ | (uint)!bVar42 * 0x50;
        bVar42 = (bool)((byte)(uVar40 >> 3) & 1);
        uStack_2794 = (uint)bVar42 * auVar47._12_4_ | (uint)!bVar42 * 0x50;
        bVar42 = (bool)((byte)(uVar40 >> 4) & 1);
        uStack_2790 = (uint)bVar42 * auVar47._16_4_ | (uint)!bVar42 * 0x50;
        bVar42 = (bool)((byte)(uVar40 >> 5) & 1);
        uStack_278c = (uint)bVar42 * auVar47._20_4_ | (uint)!bVar42 * 0x50;
        bVar42 = (bool)((byte)(uVar40 >> 6) & 1);
        uStack_2788 = (uint)bVar42 * auVar47._24_4_ | (uint)!bVar42 * 0x50;
        bVar42 = SUB81(uVar40 >> 7,0);
        uStack_2784 = (uint)bVar42 * auVar47._28_4_ | (uint)!bVar42 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar82 = ZEXT3264(local_1e80);
        auVar47 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar50);
        local_2780 = (uint)(bVar30 & 1) * auVar47._0_4_ |
                     (uint)!(bool)(bVar30 & 1) * local_1e80._0_4_;
        bVar42 = (bool)((byte)(uVar43 >> 1) & 1);
        uStack_277c = (uint)bVar42 * auVar47._4_4_ | (uint)!bVar42 * local_1e80._4_4_;
        bVar42 = (bool)((byte)(uVar43 >> 2) & 1);
        uStack_2778 = (uint)bVar42 * auVar47._8_4_ | (uint)!bVar42 * local_1e80._8_4_;
        bVar42 = (bool)((byte)(uVar43 >> 3) & 1);
        uStack_2774 = (uint)bVar42 * auVar47._12_4_ | (uint)!bVar42 * local_1e80._12_4_;
        bVar42 = (bool)((byte)(uVar43 >> 4) & 1);
        uStack_2770 = (uint)bVar42 * auVar47._16_4_ | (uint)!bVar42 * local_1e80._16_4_;
        bVar42 = (bool)((byte)(uVar43 >> 5) & 1);
        uStack_276c = (uint)bVar42 * auVar47._20_4_ | (uint)!bVar42 * local_1e80._20_4_;
        bVar42 = (bool)((byte)(uVar43 >> 6) & 1);
        uStack_2768 = (uint)bVar42 * auVar47._24_4_ | (uint)!bVar42 * local_1e80._24_4_;
        bVar42 = SUB81(uVar43 >> 7,0);
        uStack_2764 = (uint)bVar42 * auVar47._28_4_ | (uint)!bVar42 * local_1e80._28_4_;
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar81 = ZEXT3264(auVar47);
        auVar50 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar50);
        local_2760._0_4_ =
             (uint)(bVar30 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar47._0_4_;
        bVar42 = (bool)((byte)(uVar43 >> 1) & 1);
        local_2760._4_4_ = (uint)bVar42 * auVar50._4_4_ | (uint)!bVar42 * auVar47._4_4_;
        bVar42 = (bool)((byte)(uVar43 >> 2) & 1);
        local_2760._8_4_ = (uint)bVar42 * auVar50._8_4_ | (uint)!bVar42 * auVar47._8_4_;
        bVar42 = (bool)((byte)(uVar43 >> 3) & 1);
        local_2760._12_4_ = (uint)bVar42 * auVar50._12_4_ | (uint)!bVar42 * auVar47._12_4_;
        bVar42 = (bool)((byte)(uVar43 >> 4) & 1);
        local_2760._16_4_ = (uint)bVar42 * auVar50._16_4_ | (uint)!bVar42 * auVar47._16_4_;
        bVar42 = (bool)((byte)(uVar43 >> 5) & 1);
        local_2760._20_4_ = (uint)bVar42 * auVar50._20_4_ | (uint)!bVar42 * auVar47._20_4_;
        bVar42 = (bool)((byte)(uVar43 >> 6) & 1);
        local_2760._24_4_ = (uint)bVar42 * auVar50._24_4_ | (uint)!bVar42 * auVar47._24_4_;
        bVar42 = SUB81(uVar43 >> 7,0);
        local_2760._28_4_ = (uint)bVar42 * auVar50._28_4_ | (uint)!bVar42 * auVar47._28_4_;
        bVar30 = ~bVar30;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar40 = 5;
        }
        else {
          uVar40 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2af0 = ray + 0x100;
        puVar41 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar34 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2780;
        uStack_1e5c = uStack_277c;
        uStack_1e58 = uStack_2778;
        uStack_1e54 = uStack_2774;
        uStack_1e50 = uStack_2770;
        uStack_1e4c = uStack_276c;
        uStack_1e48 = uStack_2768;
        uStack_1e44 = uStack_2764;
        local_2608 = (local_2b08->root).ptr;
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar83 = ZEXT3264(auVar47);
        auVar44 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        auVar84 = ZEXT1664(auVar44);
        local_2b00 = This;
        local_2af8 = context;
        local_2ae8 = uVar40;
        uStack_2824 = local_2960._28_4_;
        uStack_2804 = local_2960._60_4_;
LAB_0079f641:
        pauVar34 = pauVar34 + -1;
        root.ptr = puVar41[-1];
        puVar41 = puVar41 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_0079fe1d;
        auVar47 = *pauVar34;
        uVar38 = vcmpps_avx512vl(auVar47,local_2760,1);
        if ((char)uVar38 == '\0') {
LAB_0079fe2e:
          iVar31 = 2;
        }
        else {
          uVar37 = (undefined4)uVar38;
          iVar31 = 0;
          pRVar28 = ray;
          if ((uint)POPCOUNT(uVar37) <= uVar40) {
            do {
              local_2ae0 = auVar47;
              local_2b10 = pRVar28;
              local_2b18 = 0;
              for (uVar40 = uVar38; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                local_2b18 = local_2b18 + 1;
              }
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar42 = occluded1(local_2b00,local_2b08,root,local_2b18,&local_2b19,local_2b10,
                                 (TravRayK<8,_false> *)&local_2960.field_0,local_2af8);
              bVar29 = (byte)(1 << ((uint)local_2b18 & 0x1f));
              if (!bVar42) {
                bVar29 = 0;
              }
              bVar30 = bVar30 | bVar29;
              uVar38 = uVar38 - 1 & uVar38;
              pRVar28 = local_2b10;
              auVar47 = local_2ae0;
            } while (uVar38 != 0);
            if (bVar30 == 0xff) {
              iVar31 = 3;
            }
            else {
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar42 = (bool)(bVar30 >> 1 & 1);
              bVar5 = (bool)(bVar30 >> 2 & 1);
              bVar6 = (bool)(bVar30 >> 3 & 1);
              bVar7 = (bool)(bVar30 >> 4 & 1);
              bVar8 = (bool)(bVar30 >> 5 & 1);
              bVar9 = (bool)(bVar30 >> 6 & 1);
              local_2760._4_4_ = (uint)bVar42 * auVar50._4_4_ | (uint)!bVar42 * local_2760._4_4_;
              local_2760._0_4_ =
                   (uint)(bVar30 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar30 & 1) * local_2760._0_4_
              ;
              local_2760._8_4_ = (uint)bVar5 * auVar50._8_4_ | (uint)!bVar5 * local_2760._8_4_;
              local_2760._12_4_ = (uint)bVar6 * auVar50._12_4_ | (uint)!bVar6 * local_2760._12_4_;
              local_2760._16_4_ = (uint)bVar7 * auVar50._16_4_ | (uint)!bVar7 * local_2760._16_4_;
              local_2760._20_4_ = (uint)bVar8 * auVar50._20_4_ | (uint)!bVar8 * local_2760._20_4_;
              local_2760._24_4_ = (uint)bVar9 * auVar50._24_4_ | (uint)!bVar9 * local_2760._24_4_;
              local_2760._28_4_ =
                   (uint)(bVar30 >> 7) * auVar50._28_4_ |
                   (uint)!(bool)(bVar30 >> 7) * local_2760._28_4_;
              iVar31 = 2;
            }
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar79 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar80 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar81 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar82 = ZEXT3264(auVar50);
            uVar43 = uVar43 & 0xffffffff;
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar83 = ZEXT3264(auVar50);
            auVar44 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
            auVar84 = ZEXT1664(auVar44);
            ray = local_2b10;
          }
          auVar69 = ZEXT3264(auVar47);
          uVar40 = local_2ae8;
          if ((uint)local_2ae8 < (uint)POPCOUNT(uVar37)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_0079fe1d;
                uVar12 = vcmpps_avx512vl(auVar69._0_32_,local_2760,9);
                if ((char)uVar12 == '\0') goto LAB_0079fe2e;
                local_2ab8 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar29 = bVar30;
                if (local_2ab8 == 0) goto LAB_0079fdef;
                bVar29 = ~bVar30;
                lVar39 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
                uVar40 = 0;
                goto LAB_0079f855;
              }
              auVar69 = ZEXT3264(auVar82._0_32_);
              uVar38 = 0;
              uVar32 = 8;
              do {
                uVar35 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar38 * 8);
                if (uVar35 != 8) {
                  auVar25._4_4_ = fStack_283c;
                  auVar25._0_4_ = local_2840;
                  auVar25._8_4_ = fStack_2838;
                  auVar25._12_4_ = fStack_2834;
                  auVar25._16_4_ = fStack_2830;
                  auVar25._20_4_ = fStack_282c;
                  auVar25._24_4_ = fStack_2828;
                  auVar25._28_4_ = uStack_2824;
                  uVar37 = *(undefined4 *)(root.ptr + 0x20 + uVar38 * 4);
                  auVar60._4_4_ = uVar37;
                  auVar60._0_4_ = uVar37;
                  auVar60._8_4_ = uVar37;
                  auVar60._12_4_ = uVar37;
                  auVar60._16_4_ = uVar37;
                  auVar60._20_4_ = uVar37;
                  auVar60._24_4_ = uVar37;
                  auVar60._28_4_ = uVar37;
                  auVar44 = vfmsub132ps_fma(auVar60,auVar25,local_28a0);
                  auVar26._4_4_ = fStack_281c;
                  auVar26._0_4_ = local_2820;
                  auVar26._8_4_ = fStack_2818;
                  auVar26._12_4_ = fStack_2814;
                  auVar26._16_4_ = fStack_2810;
                  auVar26._20_4_ = fStack_280c;
                  auVar26._24_4_ = fStack_2808;
                  auVar26._28_4_ = uStack_2804;
                  uVar37 = *(undefined4 *)(root.ptr + 0x40 + uVar38 * 4);
                  auVar64._4_4_ = uVar37;
                  auVar64._0_4_ = uVar37;
                  auVar64._8_4_ = uVar37;
                  auVar64._12_4_ = uVar37;
                  auVar64._16_4_ = uVar37;
                  auVar64._20_4_ = uVar37;
                  auVar64._24_4_ = uVar37;
                  auVar64._28_4_ = uVar37;
                  uVar37 = *(undefined4 *)(root.ptr + 0x60 + uVar38 * 4);
                  auVar67._4_4_ = uVar37;
                  auVar67._0_4_ = uVar37;
                  auVar67._8_4_ = uVar37;
                  auVar67._12_4_ = uVar37;
                  auVar67._16_4_ = uVar37;
                  auVar67._20_4_ = uVar37;
                  auVar67._24_4_ = uVar37;
                  auVar67._28_4_ = uVar37;
                  auVar46 = vfmsub132ps_fma(auVar64,auVar26,local_2880);
                  auVar15 = vfmsub132ps_fma(auVar67,local_2800,local_2860);
                  uVar37 = *(undefined4 *)(root.ptr + 0x30 + uVar38 * 4);
                  auVar19._4_4_ = uVar37;
                  auVar19._0_4_ = uVar37;
                  auVar19._8_4_ = uVar37;
                  auVar19._12_4_ = uVar37;
                  auVar19._16_4_ = uVar37;
                  auVar19._20_4_ = uVar37;
                  auVar19._24_4_ = uVar37;
                  auVar19._28_4_ = uVar37;
                  auVar51 = vfmsub132ps_avx512vl(local_28a0,auVar25,auVar19);
                  uVar37 = *(undefined4 *)(root.ptr + 0x50 + uVar38 * 4);
                  auVar20._4_4_ = uVar37;
                  auVar20._0_4_ = uVar37;
                  auVar20._8_4_ = uVar37;
                  auVar20._12_4_ = uVar37;
                  auVar20._16_4_ = uVar37;
                  auVar20._20_4_ = uVar37;
                  auVar20._24_4_ = uVar37;
                  auVar20._28_4_ = uVar37;
                  auVar48 = vfmsub132ps_avx512vl(local_2880,auVar26,auVar20);
                  uVar37 = *(undefined4 *)(root.ptr + 0x70 + uVar38 * 4);
                  auVar21._4_4_ = uVar37;
                  auVar21._0_4_ = uVar37;
                  auVar21._8_4_ = uVar37;
                  auVar21._12_4_ = uVar37;
                  auVar21._16_4_ = uVar37;
                  auVar21._20_4_ = uVar37;
                  auVar21._24_4_ = uVar37;
                  auVar21._28_4_ = uVar37;
                  auVar49 = vfmsub132ps_avx512vl(local_2860,local_2800,auVar21);
                  auVar47 = vpminsd_avx2(ZEXT1632(auVar44),auVar51);
                  auVar50 = vpminsd_avx2(ZEXT1632(auVar46),auVar48);
                  auVar47 = vpmaxsd_avx2(auVar47,auVar50);
                  auVar50 = vpminsd_avx2(ZEXT1632(auVar15),auVar49);
                  auVar47 = vpmaxsd_avx2(auVar47,auVar50);
                  auVar50 = vpmaxsd_avx2(ZEXT1632(auVar44),auVar51);
                  auVar51 = vpmaxsd_avx2(ZEXT1632(auVar46),auVar48);
                  auVar51 = vpminsd_avx2(auVar50,auVar51);
                  auVar50 = vpmaxsd_avx2(ZEXT1632(auVar15),auVar49);
                  auVar51 = vpminsd_avx2(auVar51,auVar50);
                  auVar27._4_4_ = uStack_277c;
                  auVar27._0_4_ = local_2780;
                  auVar27._8_4_ = uStack_2778;
                  auVar27._12_4_ = uStack_2774;
                  auVar27._16_4_ = uStack_2770;
                  auVar27._20_4_ = uStack_276c;
                  auVar27._24_4_ = uStack_2768;
                  auVar27._28_4_ = uStack_2764;
                  auVar50 = vpmaxsd_avx2(auVar47,auVar27);
                  auVar51 = vpminsd_avx2(auVar51,local_2760);
                  uVar14 = vpcmpd_avx512vl(auVar50,auVar51,2);
                  if ((byte)uVar14 != 0) {
                    auVar50 = vblendmps_avx512vl(auVar82._0_32_,auVar47);
                    bVar42 = (bool)((byte)uVar14 & 1);
                    bVar5 = (bool)((byte)(uVar14 >> 1) & 1);
                    bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
                    bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
                    bVar8 = (bool)((byte)(uVar14 >> 4) & 1);
                    bVar9 = (bool)((byte)(uVar14 >> 5) & 1);
                    bVar10 = (bool)((byte)(uVar14 >> 6) & 1);
                    bVar11 = SUB81(uVar14 >> 7,0);
                    if (uVar32 != 8) {
                      *puVar41 = uVar32;
                      puVar41 = puVar41 + 1;
                      *pauVar34 = auVar69._0_32_;
                      pauVar34 = pauVar34 + 1;
                    }
                    auVar69 = ZEXT3264(CONCAT428((uint)bVar11 * auVar50._28_4_ |
                                                 (uint)!bVar11 * auVar47._28_4_,
                                                 CONCAT424((uint)bVar10 * auVar50._24_4_ |
                                                           (uint)!bVar10 * auVar47._24_4_,
                                                           CONCAT420((uint)bVar9 * auVar50._20_4_ |
                                                                     (uint)!bVar9 * auVar47._20_4_,
                                                                     CONCAT416((uint)bVar8 *
                                                                               auVar50._16_4_ |
                                                                               (uint)!bVar8 *
                                                                               auVar47._16_4_,
                                                                               CONCAT412((uint)bVar7
                                                                                         * auVar50.
                                                  _12_4_ | (uint)!bVar7 * auVar47._12_4_,
                                                  CONCAT48((uint)bVar6 * auVar50._8_4_ |
                                                           (uint)!bVar6 * auVar47._8_4_,
                                                           CONCAT44((uint)bVar5 * auVar50._4_4_ |
                                                                    (uint)!bVar5 * auVar47._4_4_,
                                                                    (uint)bVar42 * auVar50._0_4_ |
                                                                    (uint)!bVar42 * auVar47._0_4_)))
                                                  )))));
                    uVar32 = uVar35;
                  }
                }
              } while ((uVar35 != 8) && (bVar42 = uVar38 < 3, uVar38 = uVar38 + 1, bVar42));
              iVar31 = 0;
              if (uVar32 == 8) {
LAB_0079f805:
                bVar42 = false;
                iVar31 = 4;
              }
              else {
                uVar12 = vcmpps_avx512vl(auVar69._0_32_,local_2760,9);
                bVar42 = true;
                if ((uint)POPCOUNT((int)uVar12) <= (uint)local_2ae8) {
                  *puVar41 = uVar32;
                  puVar41 = puVar41 + 1;
                  *pauVar34 = auVar69._0_32_;
                  pauVar34 = pauVar34 + 1;
                  goto LAB_0079f805;
                }
              }
              root.ptr = uVar32;
            } while (bVar42);
          }
        }
        goto LAB_0079fe20;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar40 = uVar40 + 1;
    lVar39 = lVar39 + 0xb0;
    if (local_2ab8 <= uVar40) break;
LAB_0079f855:
    local_2ae0._0_8_ = uVar40;
    uVar38 = 0;
    bVar36 = bVar29;
    while (uVar32 = (ulong)*(uint *)(lVar39 + -0x10 + uVar38 * 4), uVar32 != 0xffffffff) {
      uVar37 = *(undefined4 *)(lVar39 + -0xa0 + uVar38 * 4);
      auVar58._4_4_ = uVar37;
      auVar58._0_4_ = uVar37;
      auVar58._8_4_ = uVar37;
      auVar58._12_4_ = uVar37;
      auVar58._16_4_ = uVar37;
      auVar58._20_4_ = uVar37;
      auVar58._24_4_ = uVar37;
      auVar58._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x90 + uVar38 * 4);
      auVar63._4_4_ = uVar37;
      auVar63._0_4_ = uVar37;
      auVar63._8_4_ = uVar37;
      auVar63._12_4_ = uVar37;
      auVar63._16_4_ = uVar37;
      auVar63._20_4_ = uVar37;
      auVar63._24_4_ = uVar37;
      auVar63._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x80 + uVar38 * 4);
      auVar68._4_4_ = uVar37;
      auVar68._0_4_ = uVar37;
      auVar68._8_4_ = uVar37;
      auVar68._12_4_ = uVar37;
      auVar68._16_4_ = uVar37;
      auVar68._20_4_ = uVar37;
      auVar68._24_4_ = uVar37;
      auVar68._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x70 + uVar38 * 4);
      auVar46._4_4_ = uVar37;
      auVar46._0_4_ = uVar37;
      auVar46._8_4_ = uVar37;
      auVar46._12_4_ = uVar37;
      auVar61._16_4_ = uVar37;
      auVar61._0_16_ = auVar46;
      auVar61._20_4_ = uVar37;
      auVar61._24_4_ = uVar37;
      auVar61._28_4_ = uVar37;
      uVar37 = *(undefined4 *)(lVar39 + -0x60 + uVar38 * 4);
      auVar44._4_4_ = uVar37;
      auVar44._0_4_ = uVar37;
      auVar44._8_4_ = uVar37;
      auVar44._12_4_ = uVar37;
      auVar66._16_4_ = uVar37;
      auVar66._0_16_ = auVar44;
      auVar66._20_4_ = uVar37;
      auVar66._24_4_ = uVar37;
      auVar66._28_4_ = uVar37;
      fVar1 = *(float *)(lVar39 + -0x50 + uVar38 * 4);
      auVar54._4_4_ = fVar1;
      auVar54._0_4_ = fVar1;
      auVar54._8_4_ = fVar1;
      auVar54._12_4_ = fVar1;
      auVar54._16_4_ = fVar1;
      auVar54._20_4_ = fVar1;
      auVar54._24_4_ = fVar1;
      auVar54._28_4_ = fVar1;
      fVar2 = *(float *)(lVar39 + -0x40 + uVar38 * 4);
      auVar78._4_4_ = fVar2;
      auVar78._0_4_ = fVar2;
      auVar78._8_4_ = fVar2;
      auVar78._12_4_ = fVar2;
      auVar78._16_4_ = fVar2;
      auVar78._20_4_ = fVar2;
      auVar78._24_4_ = fVar2;
      auVar78._28_4_ = fVar2;
      auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar39 + -0x30 + uVar38 * 4)));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar39 + -0x20 + uVar38 * 4)));
      auVar44 = vmulss_avx512f(auVar44,auVar53._0_16_);
      auVar49._0_4_ = auVar44._0_4_;
      auVar49._4_4_ = auVar49._0_4_;
      auVar49._8_4_ = auVar49._0_4_;
      auVar49._12_4_ = auVar49._0_4_;
      auVar49._16_4_ = auVar49._0_4_;
      auVar49._20_4_ = auVar49._0_4_;
      auVar49._24_4_ = auVar49._0_4_;
      auVar49._28_4_ = auVar49._0_4_;
      auVar54 = vfmsub231ps_avx512vl(auVar49,auVar52,auVar54);
      fVar2 = fVar1 * fVar2;
      auVar56._4_4_ = fVar2;
      auVar56._0_4_ = fVar2;
      auVar56._8_4_ = fVar2;
      auVar56._12_4_ = fVar2;
      auVar56._16_4_ = fVar2;
      auVar56._20_4_ = fVar2;
      auVar56._24_4_ = fVar2;
      auVar56._28_4_ = fVar2;
      auVar55 = vfmsub231ps_avx512vl(auVar56,auVar53,auVar61);
      auVar45 = vmulss_avx512f(auVar46,auVar52._0_16_);
      auVar57._0_4_ = auVar45._0_4_;
      auVar57._4_4_ = auVar57._0_4_;
      auVar57._8_4_ = auVar57._0_4_;
      auVar57._12_4_ = auVar57._0_4_;
      auVar57._16_4_ = auVar57._0_4_;
      auVar57._20_4_ = auVar57._0_4_;
      auVar57._24_4_ = auVar57._0_4_;
      auVar57._28_4_ = auVar57._0_4_;
      auVar17 = vfmsub231ps_fma(auVar57,auVar78,auVar66);
      auVar48 = vsubps_avx(auVar58,*(undefined1 (*) [32])ray);
      auVar49 = vsubps_avx(auVar63,*(undefined1 (*) [32])(ray + 0x20));
      auVar56 = vsubps_avx(auVar68,*(undefined1 (*) [32])(ray + 0x40));
      auVar47 = *(undefined1 (*) [32])(ray + 0x80);
      auVar50 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar51 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar69._0_4_ = auVar50._0_4_ * auVar56._0_4_;
      auVar69._4_4_ = auVar50._4_4_ * auVar56._4_4_;
      auVar69._8_4_ = auVar50._8_4_ * auVar56._8_4_;
      auVar69._12_4_ = auVar50._12_4_ * auVar56._12_4_;
      auVar69._16_4_ = auVar50._16_4_ * auVar56._16_4_;
      auVar69._20_4_ = auVar50._20_4_ * auVar56._20_4_;
      auVar69._28_36_ = in_ZMM12._28_36_;
      auVar69._24_4_ = auVar50._24_4_ * auVar56._24_4_;
      auVar46 = vfmsub231ps_fma(auVar69._0_32_,auVar49,auVar51);
      auVar76._0_4_ = auVar51._0_4_ * auVar48._0_4_;
      auVar76._4_4_ = auVar51._4_4_ * auVar48._4_4_;
      auVar76._8_4_ = auVar51._8_4_ * auVar48._8_4_;
      auVar76._12_4_ = auVar51._12_4_ * auVar48._12_4_;
      auVar76._16_4_ = auVar51._16_4_ * auVar48._16_4_;
      auVar76._20_4_ = auVar51._20_4_ * auVar48._20_4_;
      auVar76._28_36_ = in_ZMM13._28_36_;
      auVar76._24_4_ = auVar51._24_4_ * auVar48._24_4_;
      auVar44 = vfmsub231ps_fma(auVar76._0_32_,auVar56,auVar47);
      auVar77._0_4_ = auVar47._0_4_ * auVar49._0_4_;
      auVar77._4_4_ = auVar47._4_4_ * auVar49._4_4_;
      auVar77._8_4_ = auVar47._8_4_ * auVar49._8_4_;
      auVar77._12_4_ = auVar47._12_4_ * auVar49._12_4_;
      auVar77._16_4_ = auVar47._16_4_ * auVar49._16_4_;
      auVar77._20_4_ = auVar47._20_4_ * auVar49._20_4_;
      auVar77._28_36_ = in_ZMM14._28_36_;
      auVar77._24_4_ = auVar47._24_4_ * auVar49._24_4_;
      auVar18 = vfmsub231ps_fma(auVar77._0_32_,auVar48,auVar50);
      in_ZMM14 = ZEXT1664(auVar18);
      auVar22._4_4_ = auVar51._4_4_ * auVar17._4_4_;
      auVar22._0_4_ = auVar51._0_4_ * auVar17._0_4_;
      auVar22._8_4_ = auVar51._8_4_ * auVar17._8_4_;
      auVar22._12_4_ = auVar51._12_4_ * auVar17._12_4_;
      auVar22._16_4_ = auVar51._16_4_ * 0.0;
      auVar22._20_4_ = auVar51._20_4_ * 0.0;
      auVar22._24_4_ = auVar51._24_4_ * 0.0;
      auVar22._28_4_ = auVar51._28_4_;
      auVar15 = vfmadd231ps_fma(auVar22,auVar55,auVar50);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar54,auVar47);
      vandps_avx512vl(ZEXT1632(auVar15),auVar83._0_32_);
      auVar47 = vmulps_avx512vl(auVar53,ZEXT1632(auVar18));
      auVar47 = vfmadd231ps_avx512vl(auVar47,ZEXT1632(auVar44),auVar52);
      auVar16 = vfmadd231ps_fma(auVar47,ZEXT1632(auVar46),auVar78);
      auVar52._0_4_ = auVar57._0_4_ ^ auVar16._0_4_;
      uVar70 = auVar45._4_4_;
      auVar52._4_4_ = uVar70 ^ auVar16._4_4_;
      uVar71 = auVar45._8_4_;
      auVar52._8_4_ = uVar71 ^ auVar16._8_4_;
      uVar72 = auVar45._12_4_;
      auVar52._12_4_ = uVar72 ^ auVar16._12_4_;
      uVar37 = auVar55._16_4_;
      auVar52._16_4_ = uVar37;
      uVar73 = auVar55._20_4_;
      auVar52._20_4_ = uVar73;
      uVar74 = auVar55._24_4_;
      auVar52._24_4_ = uVar74;
      uVar75 = auVar55._28_4_;
      auVar52._28_4_ = uVar75;
      uVar12 = vcmpps_avx512vl(auVar52,auVar84._0_32_,5);
      bVar33 = (byte)uVar12 & bVar36;
      local_2b18 = CONCAT71(local_2b18._1_7_,bVar36);
      if (bVar33 == 0) {
LAB_0079f973:
        in_ZMM12 = ZEXT1664(auVar46);
        bVar33 = 0;
      }
      else {
        auVar53._4_4_ = fVar1 * auVar18._4_4_;
        auVar53._0_4_ = fVar1 * auVar18._0_4_;
        auVar53._8_4_ = fVar1 * auVar18._8_4_;
        auVar53._12_4_ = fVar1 * auVar18._12_4_;
        auVar53._16_4_ = fVar1 * 0.0;
        auVar53._20_4_ = fVar1 * 0.0;
        auVar53._24_4_ = fVar1 * 0.0;
        auVar53._28_4_ = fVar1;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar66,auVar53);
        auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar61,ZEXT1632(auVar44));
        auVar62._0_4_ = auVar57._0_4_ ^ auVar46._0_4_;
        auVar62._4_4_ = uVar70 ^ auVar46._4_4_;
        auVar62._8_4_ = uVar71 ^ auVar46._8_4_;
        auVar62._12_4_ = uVar72 ^ auVar46._12_4_;
        auVar62._16_4_ = uVar37;
        auVar62._20_4_ = uVar73;
        auVar62._24_4_ = uVar74;
        auVar62._28_4_ = uVar75;
        uVar12 = vcmpps_avx512vl(auVar62,auVar84._0_32_,5);
        bVar33 = bVar33 & (byte)uVar12;
        if (bVar33 == 0) goto LAB_0079f973;
        auVar44 = ZEXT816(0) << 0x20;
        auVar50 = auVar79._0_32_;
        in_ZMM12 = ZEXT3264(auVar50);
        vandps_avx512vl(ZEXT1632(auVar15),auVar50);
        auVar47 = vsubps_avx(auVar50,auVar52);
        uVar12 = vcmpps_avx512vl(auVar47,auVar62,5);
        bVar33 = bVar33 & (byte)uVar12;
        if (bVar33 == 0) {
LAB_0079fced:
          bVar33 = 0;
        }
        else {
          auVar23._4_4_ = auVar56._4_4_ * auVar17._4_4_;
          auVar23._0_4_ = auVar56._0_4_ * auVar17._0_4_;
          auVar23._8_4_ = auVar56._8_4_ * auVar17._8_4_;
          auVar23._12_4_ = auVar56._12_4_ * auVar17._12_4_;
          auVar23._16_4_ = auVar56._16_4_ * 0.0;
          auVar23._20_4_ = auVar56._20_4_ * 0.0;
          auVar23._24_4_ = auVar56._24_4_ * 0.0;
          auVar23._28_4_ = auVar47._28_4_;
          auVar46 = vfmadd213ps_fma(auVar49,auVar55,auVar23);
          auVar46 = vfmadd213ps_fma(auVar48,auVar54,ZEXT1632(auVar46));
          auVar65._0_4_ = auVar79._0_4_ * *(float *)(ray + 0x60);
          auVar65._4_4_ = auVar79._4_4_ * *(float *)(ray + 100);
          auVar65._8_4_ = auVar79._8_4_ * *(float *)(ray + 0x68);
          auVar65._12_4_ = auVar79._12_4_ * *(float *)(ray + 0x6c);
          auVar65._16_4_ = auVar79._16_4_ * *(float *)(ray + 0x70);
          auVar65._20_4_ = auVar79._20_4_ * *(float *)(ray + 0x74);
          auVar65._24_4_ = auVar79._24_4_ * *(float *)(ray + 0x78);
          auVar65._28_4_ = 0;
          auVar59._0_4_ = auVar57._0_4_ ^ auVar46._0_4_;
          auVar59._4_4_ = uVar70 ^ auVar46._4_4_;
          auVar59._8_4_ = uVar71 ^ auVar46._8_4_;
          auVar59._12_4_ = uVar72 ^ auVar46._12_4_;
          auVar59._16_4_ = uVar37;
          auVar59._20_4_ = uVar73;
          auVar59._24_4_ = uVar74;
          auVar59._28_4_ = uVar75;
          auVar24._4_4_ = auVar79._4_4_ * *(float *)(ray + 0x104);
          auVar24._0_4_ = auVar79._0_4_ * *(float *)(ray + 0x100);
          auVar24._8_4_ = auVar79._8_4_ * *(float *)(ray + 0x108);
          auVar24._12_4_ = auVar79._12_4_ * *(float *)(ray + 0x10c);
          auVar24._16_4_ = auVar79._16_4_ * *(float *)(ray + 0x110);
          auVar24._20_4_ = auVar79._20_4_ * *(float *)(ray + 0x114);
          auVar24._24_4_ = auVar79._24_4_ * *(float *)(ray + 0x118);
          auVar24._28_4_ = auVar47._28_4_;
          uVar12 = vcmpps_avx512vl(auVar59,auVar24,2);
          uVar13 = vcmpps_avx512vl(auVar65,auVar59,1);
          bVar33 = bVar33 & (byte)uVar12 & (byte)uVar13;
          if (bVar33 == 0) goto LAB_0079fced;
          uVar12 = vcmpps_avx512vl(ZEXT1632(auVar15),ZEXT832(0) << 0x20,4);
          bVar33 = bVar33 & (byte)uVar12;
          if (bVar33 != 0) {
            local_2a40 = ZEXT1632(auVar17);
            local_2a20 = auVar55;
            local_2a00 = auVar54;
            local_29e0 = auVar50;
            local_29c0 = auVar59;
            _local_29a0 = auVar62;
            _local_2980 = auVar52;
          }
        }
        auVar79 = ZEXT3264(auVar50);
        auVar46 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
        auVar84 = ZEXT1664(auVar46);
      }
      in_ZMM13 = ZEXT1664(auVar44);
      auVar46 = auVar84._0_16_;
      pGVar3 = (local_2af8->scene->geometries).items[uVar32].ptr;
      uVar70 = pGVar3->mask;
      auVar55._4_4_ = uVar70;
      auVar55._0_4_ = uVar70;
      auVar55._8_4_ = uVar70;
      auVar55._12_4_ = uVar70;
      auVar55._16_4_ = uVar70;
      auVar55._20_4_ = uVar70;
      auVar55._24_4_ = uVar70;
      auVar55._28_4_ = uVar70;
      uVar12 = vptestmd_avx512vl(auVar55,*(undefined1 (*) [32])(ray + 0x120));
      bVar33 = (byte)uVar12 & bVar33;
      uVar32 = (ulong)bVar33;
      if (bVar33 != 0) {
        uVar35 = uVar43;
        if ((local_2af8->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar40 = local_2ae0._0_8_;
        }
        else {
          auVar47 = vrcp14ps_avx512vl(local_29e0);
          auVar50 = vfnmadd213ps_avx512vl(auVar47,local_29e0,auVar80._0_32_);
          auVar15 = vfmadd132ps_fma(auVar50,auVar47,auVar47);
          local_26e0._4_4_ = auVar15._4_4_ * (float)local_2980._4_4_;
          local_26e0._0_4_ = auVar15._0_4_ * (float)local_2980._0_4_;
          local_26e0._8_4_ = auVar15._8_4_ * fStack_2978;
          local_26e0._12_4_ = auVar15._12_4_ * fStack_2974;
          local_26e0._16_4_ = fStack_2970 * 0.0;
          local_26e0._20_4_ = fStack_296c * 0.0;
          local_26e0._24_4_ = fStack_2968 * 0.0;
          local_26e0._28_4_ = auVar47._28_4_;
          local_26c0 = auVar15._0_4_ * (float)local_29a0._0_4_;
          fStack_26bc = auVar15._4_4_ * (float)local_29a0._4_4_;
          fStack_26b8 = auVar15._8_4_ * fStack_2998;
          fStack_26b4 = auVar15._12_4_ * fStack_2994;
          fStack_26b0 = fStack_2990 * 0.0;
          fStack_26ac = fStack_298c * 0.0;
          uStack_26a4 = local_29e0._28_4_;
          fStack_26a8 = fStack_2988 * 0.0;
          local_2680 = vpbroadcastd_avx512vl();
          local_26a0 = vpbroadcastd_avx512vl();
          local_2740 = local_2a00._0_8_;
          uStack_2738 = local_2a00._8_8_;
          uStack_2730 = local_2a00._16_8_;
          uStack_2728 = local_2a00._24_8_;
          local_2720 = local_2a20._0_8_;
          uStack_2718 = local_2a20._8_8_;
          uStack_2710 = local_2a20._16_8_;
          uStack_2708 = local_2a20._24_8_;
          local_2700 = local_2a40;
          vpcmpeqd_avx2(local_26e0,local_26e0);
          uStack_265c = local_2af8->user->instID[0];
          local_2660 = uStack_265c;
          uStack_2658 = uStack_265c;
          uStack_2654 = uStack_265c;
          uStack_2650 = uStack_265c;
          uStack_264c = uStack_265c;
          uStack_2648 = uStack_265c;
          uStack_2644 = uStack_265c;
          uStack_263c = local_2af8->user->instPrimID[0];
          local_2640 = uStack_263c;
          uStack_2638 = uStack_263c;
          uStack_2634 = uStack_263c;
          uStack_2630 = uStack_263c;
          uStack_262c = uStack_263c;
          uStack_2628 = uStack_263c;
          uStack_2624 = uStack_263c;
          local_2a60 = *(int *)(ray + 0x100);
          iStack_2a5c = *(int *)(ray + 0x104);
          iStack_2a58 = *(int *)(ray + 0x108);
          iStack_2a54 = *(int *)(ray + 0x10c);
          iStack_2a50 = *(int *)(ray + 0x110);
          iStack_2a4c = *(int *)(ray + 0x114);
          iStack_2a48 = *(int *)(ray + 0x118);
          iStack_2a44 = *(int *)(ray + 0x11c);
          auVar47 = vmulps_avx512vl(ZEXT1632(auVar15),local_29c0);
          bVar42 = (bool)(bVar33 >> 1 & 1);
          bVar5 = (bool)(bVar33 >> 2 & 1);
          bVar6 = (bool)(bVar33 >> 3 & 1);
          bVar7 = (bool)(bVar33 >> 4 & 1);
          bVar8 = (bool)(bVar33 >> 5 & 1);
          bVar9 = (bool)(bVar33 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar33 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar33 & 1) * local_2a60;
          *(uint *)(ray + 0x104) = (uint)bVar42 * auVar47._4_4_ | (uint)!bVar42 * iStack_2a5c;
          *(uint *)(ray + 0x108) = (uint)bVar5 * auVar47._8_4_ | (uint)!bVar5 * iStack_2a58;
          *(uint *)(ray + 0x10c) = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * iStack_2a54;
          *(uint *)(ray + 0x110) = (uint)bVar7 * auVar47._16_4_ | (uint)!bVar7 * iStack_2a50;
          *(uint *)(ray + 0x114) = (uint)bVar8 * auVar47._20_4_ | (uint)!bVar8 * iStack_2a4c;
          *(uint *)(ray + 0x118) = (uint)bVar9 * auVar47._24_4_ | (uint)!bVar9 * iStack_2a48;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar33 >> 7) * auVar47._28_4_ | (uint)!(bool)(bVar33 >> 7) * iStack_2a44;
          local_2a80 = vpmovm2d_avx512vl(uVar32);
          local_2ab0.valid = (int *)local_2a80;
          local_2ab0.geometryUserPtr = pGVar3->userPtr;
          local_2ab0.context = local_2af8->user;
          local_2ab0.hit = (RTCHitN *)&local_2740;
          local_2ab0.N = 8;
          local_2ab0.ray = (RTCRayN *)ray;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(auVar44);
            in_ZMM14 = ZEXT1664(auVar18);
            local_2b10 = ray;
            (*pGVar3->occlusionFilterN)(&local_2ab0);
            auVar44 = vxorps_avx512vl(auVar46,auVar46);
            auVar84 = ZEXT1664(auVar44);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar83 = ZEXT3264(auVar47);
            uVar35 = uVar43 & 0xffffffff;
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar82 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar81 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar80 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar79 = ZEXT3264(auVar47);
            ray = local_2b10;
          }
          auVar44 = auVar84._0_16_;
          uVar32 = vptestmd_avx512vl(local_2a80,local_2a80);
          uVar40 = local_2ae0._0_8_;
          if ((char)uVar32 != '\0') {
            p_Var4 = local_2af8->args->filter;
            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
               (((local_2af8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              (*p_Var4)(&local_2ab0);
              auVar44 = vxorps_avx512vl(auVar44,auVar44);
              auVar84 = ZEXT1664(auVar44);
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar83 = ZEXT3264(auVar47);
              uVar35 = uVar43 & 0xffffffff;
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar82 = ZEXT3264(auVar47);
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar81 = ZEXT3264(auVar47);
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar80 = ZEXT3264(auVar47);
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar79 = ZEXT3264(auVar47);
            }
            uVar32 = vptestmd_avx512vl(local_2a80,local_2a80);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar42 = (bool)((byte)uVar32 & 1);
            bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar32 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar32 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar32 >> 6) & 1);
            bVar11 = SUB81(uVar32 >> 7,0);
            *(uint *)(local_2ab0.ray + 0x100) =
                 (uint)bVar42 * auVar47._0_4_ | (uint)!bVar42 * *(int *)(local_2ab0.ray + 0x100);
            *(uint *)(local_2ab0.ray + 0x104) =
                 (uint)bVar5 * auVar47._4_4_ | (uint)!bVar5 * *(int *)(local_2ab0.ray + 0x104);
            *(uint *)(local_2ab0.ray + 0x108) =
                 (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * *(int *)(local_2ab0.ray + 0x108);
            *(uint *)(local_2ab0.ray + 0x10c) =
                 (uint)bVar7 * auVar47._12_4_ | (uint)!bVar7 * *(int *)(local_2ab0.ray + 0x10c);
            *(uint *)(local_2ab0.ray + 0x110) =
                 (uint)bVar8 * auVar47._16_4_ | (uint)!bVar8 * *(int *)(local_2ab0.ray + 0x110);
            *(uint *)(local_2ab0.ray + 0x114) =
                 (uint)bVar9 * auVar47._20_4_ | (uint)!bVar9 * *(int *)(local_2ab0.ray + 0x114);
            *(uint *)(local_2ab0.ray + 0x118) =
                 (uint)bVar10 * auVar47._24_4_ | (uint)!bVar10 * *(int *)(local_2ab0.ray + 0x118);
            *(uint *)(local_2ab0.ray + 0x11c) =
                 (uint)bVar11 * auVar47._28_4_ | (uint)!bVar11 * *(int *)(local_2ab0.ray + 0x11c);
            uVar40 = local_2ae0._0_8_;
          }
          bVar42 = (bool)((byte)uVar32 & 1);
          bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar32 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar32 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar32 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar32 >> 6) & 1);
          bVar11 = SUB81(uVar32 >> 7,0);
          *(uint *)local_2af0 = (uint)bVar42 * *(int *)local_2af0 | (uint)!bVar42 * local_2a60;
          *(uint *)(local_2af0 + 4) =
               (uint)bVar5 * *(int *)(local_2af0 + 4) | (uint)!bVar5 * iStack_2a5c;
          *(uint *)(local_2af0 + 8) =
               (uint)bVar6 * *(int *)(local_2af0 + 8) | (uint)!bVar6 * iStack_2a58;
          *(uint *)(local_2af0 + 0xc) =
               (uint)bVar7 * *(int *)(local_2af0 + 0xc) | (uint)!bVar7 * iStack_2a54;
          *(uint *)(local_2af0 + 0x10) =
               (uint)bVar8 * *(int *)(local_2af0 + 0x10) | (uint)!bVar8 * iStack_2a50;
          *(uint *)(local_2af0 + 0x14) =
               (uint)bVar9 * *(int *)(local_2af0 + 0x14) | (uint)!bVar9 * iStack_2a4c;
          *(uint *)(local_2af0 + 0x18) =
               (uint)bVar10 * *(int *)(local_2af0 + 0x18) | (uint)!bVar10 * iStack_2a48;
          *(uint *)(local_2af0 + 0x1c) =
               (uint)bVar11 * *(int *)(local_2af0 + 0x1c) | (uint)!bVar11 * iStack_2a44;
        }
        bVar36 = (byte)local_2b18 & ~(byte)uVar32;
        uVar43 = uVar35;
      }
      if ((bVar36 == 0) || (bVar42 = 2 < uVar38, uVar38 = uVar38 + 1, bVar42)) break;
    }
    bVar29 = bVar29 & bVar36;
    if (bVar29 == 0) break;
  }
  bVar29 = ~bVar29;
LAB_0079fdef:
  bVar30 = bVar30 | bVar29;
  uVar40 = local_2ae8;
  if (bVar30 == 0xff) {
LAB_0079fe1d:
    iVar31 = 3;
  }
  else {
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    bVar42 = (bool)(bVar30 >> 1 & 1);
    bVar5 = (bool)(bVar30 >> 2 & 1);
    bVar6 = (bool)(bVar30 >> 3 & 1);
    bVar7 = (bool)(bVar30 >> 4 & 1);
    bVar8 = (bool)(bVar30 >> 5 & 1);
    bVar9 = (bool)(bVar30 >> 6 & 1);
    local_2760._4_4_ = (uint)bVar42 * auVar47._4_4_ | (uint)!bVar42 * local_2760._4_4_;
    local_2760._0_4_ =
         (uint)(bVar30 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar30 & 1) * local_2760._0_4_;
    local_2760._8_4_ = (uint)bVar5 * auVar47._8_4_ | (uint)!bVar5 * local_2760._8_4_;
    local_2760._12_4_ = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * local_2760._12_4_;
    local_2760._16_4_ = (uint)bVar7 * auVar47._16_4_ | (uint)!bVar7 * local_2760._16_4_;
    local_2760._20_4_ = (uint)bVar8 * auVar47._20_4_ | (uint)!bVar8 * local_2760._20_4_;
    local_2760._24_4_ = (uint)bVar9 * auVar47._24_4_ | (uint)!bVar9 * local_2760._24_4_;
    local_2760._28_4_ =
         (uint)(bVar30 >> 7) * auVar47._28_4_ | (uint)!(bool)(bVar30 >> 7) * local_2760._28_4_;
    iVar31 = 0;
  }
LAB_0079fe20:
  if (iVar31 == 3) {
    bVar30 = bVar30 & (byte)uVar43;
    bVar42 = (bool)(bVar30 >> 1 & 1);
    bVar5 = (bool)(bVar30 >> 2 & 1);
    bVar6 = (bool)(bVar30 >> 3 & 1);
    bVar7 = (bool)(bVar30 >> 4 & 1);
    bVar8 = (bool)(bVar30 >> 5 & 1);
    bVar9 = (bool)(bVar30 >> 6 & 1);
    *(uint *)local_2af0 =
         (uint)(bVar30 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar30 & 1) * *(int *)local_2af0;
    *(uint *)(local_2af0 + 4) =
         (uint)bVar42 * auVar81._4_4_ | (uint)!bVar42 * *(int *)(local_2af0 + 4);
    *(uint *)(local_2af0 + 8) =
         (uint)bVar5 * auVar81._8_4_ | (uint)!bVar5 * *(int *)(local_2af0 + 8);
    *(uint *)(local_2af0 + 0xc) =
         (uint)bVar6 * auVar81._12_4_ | (uint)!bVar6 * *(int *)(local_2af0 + 0xc);
    *(uint *)(local_2af0 + 0x10) =
         (uint)bVar7 * auVar81._16_4_ | (uint)!bVar7 * *(int *)(local_2af0 + 0x10);
    *(uint *)(local_2af0 + 0x14) =
         (uint)bVar8 * auVar81._20_4_ | (uint)!bVar8 * *(int *)(local_2af0 + 0x14);
    *(uint *)(local_2af0 + 0x18) =
         (uint)bVar9 * auVar81._24_4_ | (uint)!bVar9 * *(int *)(local_2af0 + 0x18);
    *(uint *)(local_2af0 + 0x1c) =
         (uint)(bVar30 >> 7) * auVar81._28_4_ |
         (uint)!(bool)(bVar30 >> 7) * *(int *)(local_2af0 + 0x1c);
    return;
  }
  goto LAB_0079f641;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }